

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_search.c
# Opt level: O0

void encode_superblock(AV1_COMP *cpi,TileDataEnc *tile_data,ThreadData_conflict *td,TokenExtra **t,
                      RUN_TYPE dry_run,BLOCK_SIZE bsize,int *rate)

{
  byte bVar1;
  TX_SIZE TVar2;
  CFL_ALLOWED_TYPE CVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  MACROBLOCKD *xd_00;
  char cVar13;
  MACROBLOCK *in_RCX;
  long in_RDX;
  MACROBLOCKD *in_RSI;
  long *in_RDI;
  int in_R8D;
  BLOCK_SIZE in_R9B;
  int *in_stack_00000008;
  RUN_TYPE in_stack_00000056;
  BLOCK_SIZE in_stack_00000057;
  MACROBLOCK *in_stack_00000058;
  AV1_COMP *in_stack_00000060;
  TX_SIZE tx_size;
  int rows;
  int cols;
  TX_SIZE intra_tx_size;
  int j;
  int i;
  int max_depths;
  int depth;
  int32_t tx_size_cat;
  int tx_size_ctx;
  int start_plane;
  YV12_BUFFER_CONFIG *cfg;
  int is_compound;
  int ref;
  int plane_1;
  int plane;
  int mi_col;
  int mi_row;
  TxfmSearchParams *txfm_params;
  int is_inter;
  int mi_height;
  int mi_width;
  int mis;
  int seg_skip;
  MB_MODE_INFO *mbmi;
  MB_MODE_INFO **mi_4x4;
  MACROBLOCKD *xd;
  MACROBLOCK *x;
  int num_planes;
  AV1_COMMON *cm;
  int in_stack_fffffffffffffec8;
  int in_stack_fffffffffffffecc;
  AV1_COMMON *in_stack_fffffffffffffed0;
  undefined4 uVar14;
  undefined2 in_stack_fffffffffffffed8;
  undefined1 in_stack_fffffffffffffeda;
  bool bVar15;
  undefined4 in_stack_fffffffffffffedb;
  MV_REFERENCE_FRAME in_stack_fffffffffffffedf;
  undefined1 uVar16;
  undefined4 in_stack_fffffffffffffee0;
  undefined2 in_stack_fffffffffffffee4;
  MV_REFERENCE_FRAME in_stack_fffffffffffffee6;
  BLOCK_SIZE in_stack_fffffffffffffee7;
  uint in_stack_fffffffffffffee8;
  uint in_stack_fffffffffffffeec;
  AV1_COMMON *in_stack_fffffffffffffef0;
  AV1_COMMON *cm_00;
  MACROBLOCKD *in_stack_fffffffffffffef8;
  BLOCK_SIZE bsize_00;
  int in_stack_ffffffffffffff00;
  int in_stack_ffffffffffffff04;
  undefined4 in_stack_ffffffffffffff08;
  undefined1 in_stack_ffffffffffffff0c;
  COLOR_MAP_TYPE in_stack_ffffffffffffff0d;
  TX_SIZE in_stack_ffffffffffffff0e;
  BLOCK_SIZE in_stack_ffffffffffffff0f;
  uint in_stack_ffffffffffffff10;
  uint uVar17;
  int in_stack_ffffffffffffff14;
  int in_stack_ffffffffffffff18;
  long lVar18;
  MACROBLOCKD *xd_01;
  int in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  TX_SIZE local_b5;
  int local_b4;
  int in_stack_ffffffffffffff50;
  MACROBLOCKD *in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  undefined4 in_stack_ffffffffffffff78;
  int iVar19;
  ThreadData_conflict *td_00;
  AV1_COMP *cpi_00;
  
  cVar13 = (char)in_R8D;
  cm_00 = (AV1_COMMON *)(in_RDI + 0x77f0);
  lVar18 = in_RDX;
  xd_01 = in_RSI;
  iVar4 = av1_num_planes(cm_00);
  xd_00 = (MACROBLOCKD *)(in_RDX + 0x1a0);
  cpi_00 = *(AV1_COMP **)(in_RDX + 0x2058);
  td_00 = (ThreadData_conflict *)cpi_00->ppi;
  iVar5 = segfeature_active((segmentation *)(in_RDI + 0x8137),
                            (byte)*(undefined2 *)((long)&(td_00->mb).plane[1].coeff + 7) & 7,'\x06')
  ;
  iVar12 = *(int *)((long)in_RDI + 0x3c1c4);
  uVar6 = (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[in_R9B]
  ;
  uVar7 = (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[in_R9B]
  ;
  iVar8 = is_inter_block((MB_MODE_INFO *)in_stack_fffffffffffffed0);
  set_tx_size_search_method
            ((AV1_COMMON *)
             CONCAT17(in_stack_fffffffffffffee7,
                      CONCAT16(in_stack_fffffffffffffee6,
                               CONCAT24(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0))),
             (WinnerModeParams *)
             CONCAT17(in_stack_fffffffffffffedf,
                      CONCAT43(in_stack_fffffffffffffedb,
                               CONCAT12(in_stack_fffffffffffffeda,in_stack_fffffffffffffed8))),
             (TxfmSearchParams *)in_stack_fffffffffffffed0,in_stack_fffffffffffffecc,
             in_stack_fffffffffffffec8);
  iVar10 = xd_00->mi_row;
  iVar11 = *(int *)(in_RDX + 0x1a4);
  if (iVar8 == 0) {
    bVar1 = store_cfl_required((AV1_COMMON *)
                               CONCAT17(in_stack_fffffffffffffedf,
                                        CONCAT43(in_stack_fffffffffffffedb,
                                                 CONCAT12(in_stack_fffffffffffffeda,
                                                          in_stack_fffffffffffffed8))),
                               (MACROBLOCKD *)in_stack_fffffffffffffed0);
    *(uint *)(in_RDX + 0x3c50) = (uint)bVar1;
    *(undefined1 *)&(td_00->mb).plane[1].dqcoeff = 1;
    cm_00 = in_stack_fffffffffffffef0;
    xd_00 = in_stack_fffffffffffffef8;
    for (iVar19 = 0; iVar19 < iVar4; iVar19 = iVar19 + 1) {
      av1_encode_intra_block_plane
                ((AV1_COMP *)CONCAT44(iVar10,iVar11),
                 (MACROBLOCK *)CONCAT44(iVar19,in_stack_ffffffffffffff78),
                 (BLOCK_SIZE)((uint)in_stack_ffffffffffffff74 >> 0x18),in_stack_ffffffffffffff70,
                 (RUN_TYPE)((ulong)in_stack_ffffffffffffff68 >> 0x38),
                 (TRELLIS_OPT_TYPE)((ulong)in_stack_ffffffffffffff68 >> 0x30));
    }
    if ((((char)in_RDI[0x814c] == '\0') && (*(char *)((long)in_RDI + 0x409b9) != '\0')) &&
       ((*(byte *)(in_RDI + 0xe254) & 1) != 0)) {
      *(undefined1 *)&(td_00->mb).plane[1].dqcoeff = 0;
    }
    *(undefined4 *)(in_RDX + 0x3c50) = 0;
    iVar19 = av1_allow_palette((uint)(*(byte *)((long)in_RDI + 0x3c16f) & 1),in_R9B);
    if (iVar19 != 0) {
      in_stack_ffffffffffffff18 = 0;
      while( true ) {
        in_stack_ffffffffffffff14 = iVar4;
        if (2 < iVar4) {
          in_stack_ffffffffffffff14 = 2;
        }
        if (in_stack_ffffffffffffff14 <= in_stack_ffffffffffffff18) break;
        if (*(char *)((long)&(td_00->mb).plane[1].src_diff + (long)in_stack_ffffffffffffff18 + 6) !=
            '\0') {
          if (cVar13 == '\0') {
            in_stack_fffffffffffffed0 = *(AV1_COMMON **)(in_RDX + 0x25c58);
            av1_tokenize_color_map
                      (in_RCX,in_R8D,
                       (TokenExtra **)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                       in_stack_ffffffffffffff0f,in_stack_ffffffffffffff0e,in_stack_ffffffffffffff0d
                       ,(int)xd_01,
                       (FRAME_COUNTS *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38)
                      );
          }
          else if (cVar13 == '\x02') {
            iVar19 = av1_cost_color_map((MACROBLOCK *)
                                        CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00
                                                ),(int)((ulong)xd_00 >> 0x20),
                                        (BLOCK_SIZE)((ulong)xd_00 >> 0x18),
                                        (TX_SIZE)((ulong)xd_00 >> 0x10),
                                        (COLOR_MAP_TYPE)((ulong)xd_00 >> 8));
            *in_stack_00000008 = iVar19 + *in_stack_00000008;
          }
        }
        in_stack_ffffffffffffff18 = in_stack_ffffffffffffff18 + 1;
      }
    }
    av1_update_intra_mb_txb_context
              ((AV1_COMP *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
               (ThreadData_conflict *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
               (RUN_TYPE)((ulong)xd_01 >> 0x38),(BLOCK_SIZE)((ulong)xd_01 >> 0x30),
               (uint8_t)((ulong)xd_01 >> 0x28));
  }
  else {
    iVar4 = has_second_ref((MB_MODE_INFO *)td_00);
    set_ref_ptrs(in_stack_fffffffffffffef0,
                 (MACROBLOCKD *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                 in_stack_fffffffffffffee7,in_stack_fffffffffffffee6);
    uVar17 = in_stack_ffffffffffffff10;
    in_stack_ffffffffffffff04 = iVar11;
    in_stack_ffffffffffffff00 = iVar10;
    for (iVar19 = 0; uVar14 = (undefined4)((ulong)in_stack_fffffffffffffed0 >> 0x20),
        iVar19 < iVar4 + 1; iVar19 = iVar19 + 1) {
      in_stack_ffffffffffffff68 =
           (MACROBLOCKD *)
           get_ref_frame_yv12_buf
                     ((AV1_COMMON *)
                      CONCAT17(in_stack_fffffffffffffee7,
                               CONCAT16(in_stack_fffffffffffffee6,
                                        CONCAT24(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0
                                                ))),in_stack_fffffffffffffedf);
      av1_setup_pre_planes
                (xd_01,(int)((ulong)lVar18 >> 0x20),(YV12_BUFFER_CONFIG *)in_RCX,in_R8D,
                 in_stack_ffffffffffffff18,
                 (scale_factors *)CONCAT44(in_stack_ffffffffffffff14,uVar17),
                 in_stack_ffffffffffffff50);
    }
    in_stack_ffffffffffffff10 = uVar17 & 0xffffff;
    if (((*(byte *)(in_RDX + 0x1f6c2) & 1) != 0) &&
       (in_stack_ffffffffffffff10 = uVar17 & 0xffffff, *(int *)((long)in_RDI + 0x60ca4) == 0)) {
      in_stack_ffffffffffffff10 = CONCAT13(*(int *)(in_RDI[0x8401] + 0x48) == 8,(int3)uVar17);
    }
    in_stack_ffffffffffffff0c = (char)(in_stack_ffffffffffffff10 >> 0x18) != '\0';
    in_stack_ffffffffffffff08 = CONCAT13(in_R9B,(int3)in_stack_ffffffffffffff08);
    in_stack_ffffffffffffff0d = '\0';
    in_stack_ffffffffffffff0e = '\0';
    in_stack_ffffffffffffff0f = BLOCK_4X4;
    iVar11 = in_stack_ffffffffffffff04;
    iVar10 = in_stack_ffffffffffffff00;
    iVar9 = av1_num_planes(cm_00);
    in_stack_fffffffffffffed0 = (AV1_COMMON *)CONCAT44(uVar14,iVar9 + -1);
    av1_enc_build_inter_predictor
              ((AV1_COMMON *)in_RCX,(MACROBLOCKD *)CONCAT44(in_R8D,in_stack_ffffffffffffff18),
               in_stack_ffffffffffffff14,in_stack_ffffffffffffff10,
               (BUFFER_SET *)
               CONCAT17(in_stack_ffffffffffffff0f,
                        CONCAT16(in_stack_ffffffffffffff0e,
                                 CONCAT15(in_stack_ffffffffffffff0d,
                                          CONCAT14(in_stack_ffffffffffffff0c,
                                                   in_stack_ffffffffffffff08)))),
               (BLOCK_SIZE)((uint)in_stack_ffffffffffffff04 >> 0x18),(int)xd_01,
               in_stack_ffffffffffffff38);
    if (*(MOTION_MODE *)&(td_00->mb).plane[0].coeff == '\x01') {
      av1_build_obmc_inter_predictors_sb
                ((AV1_COMMON *)CONCAT44(iVar19,iVar4),in_stack_ffffffffffffff68);
    }
    av1_encode_sb(in_stack_00000060,in_stack_00000058,in_stack_00000057,in_stack_00000056);
    av1_tokenize_sb_vartx
              (cpi_00,td_00,(RUN_TYPE)((uint)iVar5 >> 0x18),(BLOCK_SIZE)((uint)iVar5 >> 0x10),
               (int *)CONCAT44(uVar6,uVar7),(uint8_t)((uint)iVar8 >> 0x18));
  }
  if (cVar13 == '\0') {
    iVar4 = av1_allow_intrabc(in_stack_fffffffffffffed0);
    if ((iVar4 != 0) && (iVar4 = is_intrabc_block((MB_MODE_INFO *)td_00), iVar4 != 0)) {
      *(undefined4 *)(in_RDX + 0x25d50) = 1;
    }
    if ((((*(char *)(in_RDX + 0x24df0) == '\x02') &&
         (*(int *)(in_RDX + 0x2b64 +
                  (ulong)((byte)*(undefined2 *)((long)&(td_00->mb).plane[1].coeff + 7) & 7) * 4) ==
          0)) && (*(BLOCK_SIZE *)&(td_00->mb).plane[0].src_diff != BLOCK_4X4)) &&
       ((iVar8 == 0 || ((*(char *)&(td_00->mb).plane[1].dqcoeff == '\0' && (iVar5 == 0)))))) {
      if (iVar8 == 0) {
        if (*(TX_SIZE *)((long)&(td_00->mb).plane[1].dqcoeff + 1) != ""[in_R9B]) {
          *(int *)(in_RDX + 0x25618) = *(int *)(in_RDX + 0x25618) + 1;
        }
        iVar12 = block_signals_txsize(in_R9B);
        if (iVar12 != 0) {
          iVar12 = get_tx_size_context(xd_00);
          iVar10 = bsize_to_tx_size_cat(in_R9B);
          iVar11 = tx_size_to_depth(*(TX_SIZE *)((long)&(td_00->mb).plane[1].dqcoeff + 1),in_R9B);
          iVar4 = bsize_to_max_depth(in_R9B);
          if (*(char *)(in_RSI[1].plane[2].seg_iqmatrix[5] + 9) != '\0') {
            update_cdf((aom_cdf_prob *)
                       (*(long *)(in_RDX + 0x2b38) + 0x3aa6 + (long)iVar10 * 0x18 + (long)iVar12 * 8
                       ),(int8_t)iVar11,iVar4 + 1);
          }
        }
      }
      else {
        tx_partition_count_update
                  ((AV1_COMMON *)in_RCX,(MACROBLOCK *)CONCAT44(in_R8D,in_stack_ffffffffffffff18),
                   (BLOCK_SIZE)((uint)in_stack_ffffffffffffff14 >> 0x18),
                   (FRAME_COUNTS *)
                   CONCAT17(in_stack_ffffffffffffff0f,
                            CONCAT16(in_stack_ffffffffffffff0e,
                                     CONCAT15(in_stack_ffffffffffffff0d,
                                              CONCAT14(in_stack_ffffffffffffff0c,
                                                       in_stack_ffffffffffffff08)))),
                   (uint8_t)((uint)in_stack_ffffffffffffff04 >> 0x18));
      }
    }
    else {
      in_stack_fffffffffffffee8 = uVar7;
      in_stack_fffffffffffffeec = uVar6;
      if (iVar8 == 0) {
        local_b5 = *(TX_SIZE *)((long)&(td_00->mb).plane[1].dqcoeff + 1);
      }
      else if (*(int *)(in_RDX + 0x2b64 +
                       (ulong)((byte)*(undefined2 *)((long)&(td_00->mb).plane[1].coeff + 7) & 7) * 4
                       ) == 0) {
        local_b5 = tx_size_from_tx_mode(in_R9B,*(TX_MODE *)(in_RDX + 0x24df0));
        in_stack_fffffffffffffee8 = uVar7;
        in_stack_fffffffffffffeec = uVar6;
      }
      else {
        local_b5 = '\0';
      }
      if ((int)in_RDI[0x7833] - iVar11 < (int)in_stack_fffffffffffffeec) {
        in_stack_fffffffffffffeec = (int)in_RDI[0x7833] - iVar11;
      }
      if (*(int *)((long)in_RDI + 0x3c194) - iVar10 < (int)in_stack_fffffffffffffee8) {
        in_stack_fffffffffffffee8 = *(int *)((long)in_RDI + 0x3c194) - iVar10;
      }
      for (local_b4 = 0; local_b4 < (int)in_stack_fffffffffffffee8; local_b4 = local_b4 + 1) {
        for (iVar10 = 0; iVar10 < (int)in_stack_fffffffffffffeec; iVar10 = iVar10 + 1) {
          *(TX_SIZE *)
           (*(long *)((long)((cpi_00->enc_quant_dequant_params).quants.y_quant + -1) +
                     (long)(iVar12 * local_b4 + iVar10) * 8) + 0x91) = local_b5;
        }
      }
      if (local_b5 != ""[in_R9B]) {
        *(int *)(in_RDX + 0x25618) = *(int *)(in_RDX + 0x25618) + 1;
      }
    }
  }
  bsize_00 = (BLOCK_SIZE)((ulong)xd_00 >> 0x38);
  if (((((*(char *)(in_RDX + 0x24df0) == '\x02') &&
        (iVar12 = block_signals_txsize(*(BLOCK_SIZE *)&(td_00->mb).plane[0].src_diff), iVar12 != 0))
       && (iVar8 != 0)) && ((*(char *)&(td_00->mb).plane[1].dqcoeff == '\0' && (iVar5 == 0)))) &&
     (*(int *)(in_RDX + 0x2b64 +
              (ulong)((byte)*(undefined2 *)((long)&(td_00->mb).plane[1].coeff + 7) & 7) * 4) == 0))
  {
    if (cVar13 != '\0') {
      tx_partition_set_contexts
                (cm_00,(MACROBLOCKD *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                 in_stack_fffffffffffffee7);
    }
  }
  else {
    TVar2 = *(TX_SIZE *)((long)&(td_00->mb).plane[1].dqcoeff + 1);
    if (iVar8 == 0) {
      if (in_R9B == BLOCK_4X4) {
        TVar2 = '\0';
      }
      in_stack_fffffffffffffee7 = BLOCK_4X4;
    }
    else if (*(int *)(in_RDX + 0x2b64 +
                     (ulong)((byte)*(undefined2 *)((long)&(td_00->mb).plane[1].coeff + 7) & 7) * 4)
             == 0) {
      TVar2 = tx_size_from_tx_mode(in_R9B,*(TX_MODE *)(in_RDX + 0x24df0));
    }
    else {
      TVar2 = '\0';
    }
    *(TX_SIZE *)((long)&(td_00->mb).plane[1].dqcoeff + 1) = TVar2;
    uVar7 = (uint)CONCAT11(*(undefined1 *)(in_RDX + 0x2214),TVar2);
    uVar16 = 0;
    uVar6 = (uint)*(byte *)(in_RDX + 0x2215);
    if ((*(char *)&(td_00->mb).plane[1].dqcoeff != '\0') || (bVar15 = false, iVar5 != 0)) {
      iVar12 = is_inter_block((MB_MODE_INFO *)in_stack_fffffffffffffed0);
      bVar15 = iVar12 != 0;
    }
    set_txfm_ctxs(in_stack_fffffffffffffee7,uVar6,CONCAT13(uVar16,(int3)(uVar7 >> 8)),
                  CONCAT13((char)uVar7,CONCAT12(bVar15,in_stack_fffffffffffffed8)),
                  (MACROBLOCKD *)in_stack_fffffffffffffed0);
  }
  iVar12 = is_inter_block((MB_MODE_INFO *)in_stack_fffffffffffffed0);
  if (((iVar12 != 0) && ((*(byte *)(in_RDX + 0x1ac) & 1) == 0)) &&
     (CVar3 = is_cfl_allowed((MACROBLOCKD *)
                             CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8)),
     CVar3 != '\0')) {
    cfl_store_block((MACROBLOCKD *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                    in_stack_ffffffffffffff0f,in_stack_ffffffffffffff0e);
  }
  if ((((cVar13 == '\0') && ((int)in_RDI[0x84eb] == 0)) &&
      ((*(int *)((long)in_RDI + 0x9d334) == 0 && ((int)in_RDI[0xc1a0] != 0)))) &&
     ((*(int *)(*in_RDI + 0xc750) == 0 ||
      (((*(int *)(*in_RDI + 0xc750) != 0 &&
        (*(int *)(in_RDI[0x13a91] + (long)*(int *)((long)in_RDI + 0x9d334) * 0x3380 + 0x3378) == 0))
       && ((int)in_RDI[0x13a66] == (int)in_RDI[0x13a67] + -1)))))) {
    update_zeromv_cnt((AV1_COMP *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                      (MB_MODE_INFO *)
                      CONCAT17(in_stack_ffffffffffffff0f,
                               CONCAT16(in_stack_ffffffffffffff0e,
                                        CONCAT15(in_stack_ffffffffffffff0d,
                                                 CONCAT14(in_stack_ffffffffffffff0c,
                                                          in_stack_ffffffffffffff08)))),
                      in_stack_ffffffffffffff04,in_stack_ffffffffffffff00,bsize_00);
  }
  return;
}

Assistant:

static void encode_superblock(const AV1_COMP *const cpi, TileDataEnc *tile_data,
                              ThreadData *td, TokenExtra **t, RUN_TYPE dry_run,
                              BLOCK_SIZE bsize, int *rate) {
  const AV1_COMMON *const cm = &cpi->common;
  const int num_planes = av1_num_planes(cm);
  MACROBLOCK *const x = &td->mb;
  MACROBLOCKD *const xd = &x->e_mbd;
  MB_MODE_INFO **mi_4x4 = xd->mi;
  MB_MODE_INFO *mbmi = mi_4x4[0];
  const int seg_skip =
      segfeature_active(&cm->seg, mbmi->segment_id, SEG_LVL_SKIP);
  const int mis = cm->mi_params.mi_stride;
  const int mi_width = mi_size_wide[bsize];
  const int mi_height = mi_size_high[bsize];
  const int is_inter = is_inter_block(mbmi);

  // Initialize tx_mode and tx_size_search_method
  TxfmSearchParams *txfm_params = &x->txfm_search_params;
  set_tx_size_search_method(
      cm, &cpi->winner_mode_params, txfm_params,
      cpi->sf.winner_mode_sf.enable_winner_mode_for_tx_size_srch, 1);

  const int mi_row = xd->mi_row;
  const int mi_col = xd->mi_col;
  if (!is_inter) {
    xd->cfl.store_y = store_cfl_required(cm, xd);
    mbmi->skip_txfm = 1;
    for (int plane = 0; plane < num_planes; ++plane) {
      av1_encode_intra_block_plane(cpi, x, bsize, plane, dry_run,
                                   cpi->optimize_seg_arr[mbmi->segment_id]);
    }

    // If there is at least one lossless segment, force the skip for intra
    // block to be 0, in order to avoid the segment_id to be changed by in
    // write_segment_id().
    if (!cpi->common.seg.segid_preskip && cpi->common.seg.update_map &&
        cpi->enc_seg.has_lossless_segment)
      mbmi->skip_txfm = 0;

    xd->cfl.store_y = 0;
    if (av1_allow_palette(cm->features.allow_screen_content_tools, bsize)) {
      for (int plane = 0; plane < AOMMIN(2, num_planes); ++plane) {
        if (mbmi->palette_mode_info.palette_size[plane] > 0) {
          if (!dry_run) {
            av1_tokenize_color_map(x, plane, t, bsize, mbmi->tx_size,
                                   PALETTE_MAP, tile_data->allow_update_cdf,
                                   td->counts);
          } else if (dry_run == DRY_RUN_COSTCOEFFS) {
            *rate +=
                av1_cost_color_map(x, plane, bsize, mbmi->tx_size, PALETTE_MAP);
          }
        }
      }
    }

    av1_update_intra_mb_txb_context(cpi, td, dry_run, bsize,
                                    tile_data->allow_update_cdf);
  } else {
    int ref;
    const int is_compound = has_second_ref(mbmi);

    set_ref_ptrs(cm, xd, mbmi->ref_frame[0], mbmi->ref_frame[1]);
    for (ref = 0; ref < 1 + is_compound; ++ref) {
      const YV12_BUFFER_CONFIG *cfg =
          get_ref_frame_yv12_buf(cm, mbmi->ref_frame[ref]);
      assert(IMPLIES(!is_intrabc_block(mbmi), cfg));
      av1_setup_pre_planes(xd, ref, cfg, mi_row, mi_col,
                           xd->block_ref_scale_factors[ref], num_planes);
    }
    // Predicted sample of inter mode (for Luma plane) cannot be reused if
    // nonrd_check_partition_split speed feature is enabled, Since in such cases
    // the buffer may not contain the predicted sample of best mode.
    const int start_plane =
        (x->reuse_inter_pred && (!cpi->sf.rt_sf.nonrd_check_partition_split) &&
         cm->seq_params->bit_depth == AOM_BITS_8)
            ? 1
            : 0;
    av1_enc_build_inter_predictor(cm, xd, mi_row, mi_col, NULL, bsize,
                                  start_plane, av1_num_planes(cm) - 1);
    if (mbmi->motion_mode == OBMC_CAUSAL) {
      assert(cpi->oxcf.motion_mode_cfg.enable_obmc);
      av1_build_obmc_inter_predictors_sb(cm, xd);
    }

#if CONFIG_MISMATCH_DEBUG
    if (dry_run == OUTPUT_ENABLED) {
      for (int plane = 0; plane < num_planes; ++plane) {
        const struct macroblockd_plane *pd = &xd->plane[plane];
        int pixel_c, pixel_r;
        mi_to_pixel_loc(&pixel_c, &pixel_r, mi_col, mi_row, 0, 0,
                        pd->subsampling_x, pd->subsampling_y);
        if (!is_chroma_reference(mi_row, mi_col, bsize, pd->subsampling_x,
                                 pd->subsampling_y))
          continue;
        mismatch_record_block_pre(pd->dst.buf, pd->dst.stride,
                                  cm->current_frame.order_hint, plane, pixel_c,
                                  pixel_r, pd->width, pd->height,
                                  xd->cur_buf->flags & YV12_FLAG_HIGHBITDEPTH);
      }
    }
#else
    (void)num_planes;
#endif

    av1_encode_sb(cpi, x, bsize, dry_run);
    av1_tokenize_sb_vartx(cpi, td, dry_run, bsize, rate,
                          tile_data->allow_update_cdf);
  }

  if (!dry_run) {
    if (av1_allow_intrabc(cm) && is_intrabc_block(mbmi)) td->intrabc_used = 1;
    if (txfm_params->tx_mode_search_type == TX_MODE_SELECT &&
        !xd->lossless[mbmi->segment_id] && mbmi->bsize > BLOCK_4X4 &&
        !(is_inter && (mbmi->skip_txfm || seg_skip))) {
      if (is_inter) {
        tx_partition_count_update(cm, x, bsize, td->counts,
                                  tile_data->allow_update_cdf);
      } else {
        if (mbmi->tx_size != max_txsize_rect_lookup[bsize])
          ++x->txfm_search_info.txb_split_count;
        if (block_signals_txsize(bsize)) {
          const int tx_size_ctx = get_tx_size_context(xd);
          const int32_t tx_size_cat = bsize_to_tx_size_cat(bsize);
          const int depth = tx_size_to_depth(mbmi->tx_size, bsize);
          const int max_depths = bsize_to_max_depth(bsize);

          if (tile_data->allow_update_cdf)
            update_cdf(xd->tile_ctx->tx_size_cdf[tx_size_cat][tx_size_ctx],
                       depth, max_depths + 1);
#if CONFIG_ENTROPY_STATS
          ++td->counts->intra_tx_size[tx_size_cat][tx_size_ctx][depth];
#endif
        }
      }
      assert(IMPLIES(is_rect_tx(mbmi->tx_size), is_rect_tx_allowed(xd, mbmi)));
    } else {
      int i, j;
      TX_SIZE intra_tx_size;
      // The new intra coding scheme requires no change of transform size
      if (is_inter) {
        if (xd->lossless[mbmi->segment_id]) {
          intra_tx_size = TX_4X4;
        } else {
          intra_tx_size =
              tx_size_from_tx_mode(bsize, txfm_params->tx_mode_search_type);
        }
      } else {
        intra_tx_size = mbmi->tx_size;
      }

      const int cols = AOMMIN(cm->mi_params.mi_cols - mi_col, mi_width);
      const int rows = AOMMIN(cm->mi_params.mi_rows - mi_row, mi_height);
      for (j = 0; j < rows; j++) {
        for (i = 0; i < cols; i++) mi_4x4[mis * j + i]->tx_size = intra_tx_size;
      }

      if (intra_tx_size != max_txsize_rect_lookup[bsize])
        ++x->txfm_search_info.txb_split_count;
    }
  }

  if (txfm_params->tx_mode_search_type == TX_MODE_SELECT &&
      block_signals_txsize(mbmi->bsize) && is_inter &&
      !(mbmi->skip_txfm || seg_skip) && !xd->lossless[mbmi->segment_id]) {
    if (dry_run) tx_partition_set_contexts(cm, xd, bsize);
  } else {
    TX_SIZE tx_size = mbmi->tx_size;
    // The new intra coding scheme requires no change of transform size
    if (is_inter) {
      if (xd->lossless[mbmi->segment_id]) {
        tx_size = TX_4X4;
      } else {
        tx_size = tx_size_from_tx_mode(bsize, txfm_params->tx_mode_search_type);
      }
    } else {
      tx_size = (bsize > BLOCK_4X4) ? tx_size : TX_4X4;
    }
    mbmi->tx_size = tx_size;
    set_txfm_ctxs(tx_size, xd->width, xd->height,
                  (mbmi->skip_txfm || seg_skip) && is_inter_block(mbmi), xd);
  }

#if !CONFIG_REALTIME_ONLY
  if (is_inter_block(mbmi) && !xd->is_chroma_ref && is_cfl_allowed(xd)) {
    cfl_store_block(xd, mbmi->bsize, mbmi->tx_size);
  }
#endif
  if (!dry_run) {
    if (cpi->oxcf.pass == AOM_RC_ONE_PASS && cpi->svc.temporal_layer_id == 0 &&
        cpi->sf.rt_sf.use_temporal_noise_estimate &&
        (!cpi->ppi->use_svc ||
         (cpi->ppi->use_svc &&
          !cpi->svc.layer_context[cpi->svc.temporal_layer_id].is_key_frame &&
          cpi->svc.spatial_layer_id == cpi->svc.number_spatial_layers - 1)))
      update_zeromv_cnt(cpi, mbmi, mi_row, mi_col, bsize);
  }
}